

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O1

void __thiscall
Js::TypedArray<unsigned_short,_false,_true>::TypedArray
          (TypedArray<unsigned_short,_false,_true> *this,ArrayBufferBase *arrayBuffer,
          uint32 byteOffset,uint32 mappedLength,DynamicType *type)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  
  TypedArrayBase::TypedArrayBase
            (&this->super_TypedArrayBase,arrayBuffer,byteOffset,mappedLength,2,type);
  (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.super_DynamicObject.
  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject =
       (IRecyclerVisitedObject)&PTR_Finalize_014dd878;
  uVar3 = (*(arrayBuffer->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])(arrayBuffer);
  if (uVar3 < byteOffset) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x25f,"(arrayBuffer->GetByteLength() >= byteOffset)",
                                "invalid offset");
    if (!bVar2) goto LAB_00965669;
    *puVar5 = 0;
  }
  uVar3 = (*(arrayBuffer->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])(arrayBuffer);
  if ((ulong)uVar3 < (ulong)byteOffset + (ulong)mappedLength * 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x260,
                                "(mappedLength*sizeof(TypeName)+byteOffset <= arrayBuffer->GetByteLength())"
                                ,"invalid length");
    if (!bVar2) {
LAB_00965669:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  iVar4 = (*(arrayBuffer->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])(arrayBuffer);
  (this->super_TypedArrayBase).buffer = (Type)(CONCAT44(extraout_var,iVar4) + (ulong)byteOffset);
  uVar3 = (*(arrayBuffer->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])(arrayBuffer);
  iVar4 = (*(arrayBuffer->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
                    (arrayBuffer,(ulong)uVar3);
  if ((byteOffset == 0) && ((char)iVar4 != '\0')) {
    uVar3 = (*(arrayBuffer->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])(arrayBuffer);
    if ((uVar3 >> 1 == mappedLength) &&
       (uVar3 = (type->super_Type).typeId - TypeIds_Int8Array, uVar3 < 9)) {
      (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.super_DynamicObject.
      super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject =
           (IRecyclerVisitedObject)
           ((IRecyclerVisitedObject *)(&PTR_Address_014feb60)[uVar3])->_vptr_IRecyclerVisitedObject;
    }
  }
  return;
}

Assistant:

TypedArray<TypeName, clamped, virtualAllocated>::TypedArray(ArrayBufferBase* arrayBuffer, uint32 byteOffset, uint32 mappedLength, DynamicType* type) :
        TypedArrayBase(arrayBuffer, byteOffset, mappedLength, sizeof(TypeName), type)
    {
        AssertMsg(arrayBuffer->GetByteLength() >= byteOffset, "invalid offset");
        AssertMsg(mappedLength*sizeof(TypeName)+byteOffset <= arrayBuffer->GetByteLength(), "invalid length");
        buffer = arrayBuffer->GetBuffer() + byteOffset;
        if (arrayBuffer->IsValidVirtualBufferLength(arrayBuffer->GetByteLength()) &&
             (byteOffset == 0) &&
             (mappedLength == (arrayBuffer->GetByteLength() / sizeof(TypeName)))
           )
        {
            // update the vtable
            switch (type->GetTypeId())
            {
            case TypeIds_Int8Array:
                VirtualTableInfo<Int8VirtualArray>::SetVirtualTable(this);
                break;
            case TypeIds_Uint8Array:
                VirtualTableInfo<Uint8VirtualArray>::SetVirtualTable(this);
                break;
            case TypeIds_Uint8ClampedArray:
                VirtualTableInfo<Uint8ClampedVirtualArray>::SetVirtualTable(this);
                break;
            case TypeIds_Int16Array:
                VirtualTableInfo<Int16VirtualArray>::SetVirtualTable(this);
                break;
            case TypeIds_Uint16Array:
                VirtualTableInfo<Uint16VirtualArray>::SetVirtualTable(this);
                break;
            case TypeIds_Int32Array:
                VirtualTableInfo<Int32VirtualArray>::SetVirtualTable(this);
                break;
            case TypeIds_Uint32Array:
                VirtualTableInfo<Uint32VirtualArray>::SetVirtualTable(this);
                break;
            case TypeIds_Float32Array:
                VirtualTableInfo<Float32VirtualArray>::SetVirtualTable(this);
                break;
            case TypeIds_Float64Array:
                VirtualTableInfo<Float64VirtualArray>::SetVirtualTable(this);
                break;
            default:
                break;
            }
        }
    }